

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O1

int amqpvalue_get_target(AMQP_VALUE value,TARGET_HANDLE *target_handle)

{
  bool bVar1;
  int iVar2;
  AMQP_TYPE AVar3;
  int iVar4;
  TARGET_HANDLE pTVar5;
  AMQP_VALUE pAVar6;
  AMQP_VALUE pAVar7;
  uint32_t list_item_count;
  terminus_durability durable;
  AMQP_VALUE capabilities_array;
  uint local_44;
  AMQP_VALUE local_40;
  AMQP_VALUE local_38;
  
  pTVar5 = (TARGET_HANDLE)malloc(8);
  if (pTVar5 == (TARGET_HANDLE)0x0) {
    *target_handle = (TARGET_HANDLE)0x0;
    iVar4 = 0x34ef;
  }
  else {
    pTVar5->composite_value = (AMQP_VALUE)0x0;
    *target_handle = pTVar5;
    pAVar6 = amqpvalue_get_inplace_described_value(value);
    if (pAVar6 == (AMQP_VALUE)0x0) {
      target_destroy(*target_handle);
      iVar4 = 0x34f7;
    }
    else {
      iVar2 = amqpvalue_get_list_item_count(pAVar6,&local_44);
      iVar4 = 0x34fe;
      if (iVar2 == 0) {
        if ((local_44 != 0) &&
           (pAVar7 = amqpvalue_get_list_item(pAVar6,0), pAVar7 != (AMQP_VALUE)0x0)) {
          amqpvalue_destroy(pAVar7);
        }
        if ((1 < local_44) &&
           (pAVar7 = amqpvalue_get_list_item(pAVar6,1), pAVar7 != (AMQP_VALUE)0x0)) {
          AVar3 = amqpvalue_get_type(pAVar7);
          if ((AVar3 != AMQP_TYPE_NULL) &&
             (iVar4 = amqpvalue_get_uint(pAVar7,(uint32_t *)&local_40), iVar4 != 0)) {
            amqpvalue_destroy(pAVar7);
            target_destroy(*target_handle);
            return 0x3527;
          }
          amqpvalue_destroy(pAVar7);
        }
        if ((2 < local_44) &&
           (pAVar7 = amqpvalue_get_list_item(pAVar6,2), pAVar7 != (AMQP_VALUE)0x0)) {
          AVar3 = amqpvalue_get_type(pAVar7);
          if ((AVar3 != AMQP_TYPE_NULL) &&
             (iVar4 = amqpvalue_get_symbol(pAVar7,(char **)&local_40), iVar4 != 0)) {
            amqpvalue_destroy(pAVar7);
            target_destroy(*target_handle);
            return 0x3544;
          }
          amqpvalue_destroy(pAVar7);
        }
        iVar4 = 0x3527;
        if ((3 < local_44) &&
           (pAVar7 = amqpvalue_get_list_item(pAVar6,3), pAVar7 != (AMQP_VALUE)0x0)) {
          AVar3 = amqpvalue_get_type(pAVar7);
          if ((AVar3 != AMQP_TYPE_NULL) &&
             (iVar2 = amqpvalue_get_uint(pAVar7,(uint32_t *)&local_40), iVar2 != 0)) {
            amqpvalue_destroy(pAVar7);
            target_destroy(*target_handle);
            return 0x3561;
          }
          amqpvalue_destroy(pAVar7);
        }
        if ((4 < local_44) &&
           (pAVar7 = amqpvalue_get_list_item(pAVar6,4), pAVar7 != (AMQP_VALUE)0x0)) {
          AVar3 = amqpvalue_get_type(pAVar7);
          if ((AVar3 != AMQP_TYPE_NULL) &&
             (iVar2 = amqpvalue_get_boolean(pAVar7,(_Bool *)&local_40), iVar2 != 0)) {
            amqpvalue_destroy(pAVar7);
            target_destroy(*target_handle);
            return 0x357e;
          }
          amqpvalue_destroy(pAVar7);
        }
        if ((5 < local_44) &&
           (pAVar7 = amqpvalue_get_list_item(pAVar6,5), pAVar7 != (AMQP_VALUE)0x0)) {
          AVar3 = amqpvalue_get_type(pAVar7);
          if ((AVar3 != AMQP_TYPE_NULL) && (iVar2 = amqpvalue_get_map(pAVar7,&local_40), iVar2 != 0)
             ) {
            amqpvalue_destroy(pAVar7);
            target_destroy(*target_handle);
            return 0x359b;
          }
          amqpvalue_destroy(pAVar7);
        }
        if ((6 < local_44) &&
           (pAVar6 = amqpvalue_get_list_item(pAVar6,6), pAVar6 != (AMQP_VALUE)0x0)) {
          AVar3 = amqpvalue_get_type(pAVar6);
          if (AVar3 != AMQP_TYPE_NULL) {
            local_40 = (AMQP_VALUE)0x0;
            AVar3 = amqpvalue_get_type(pAVar6);
            if (((AVar3 == AMQP_TYPE_ARRAY) &&
                (iVar2 = amqpvalue_get_array(pAVar6,&local_38), iVar2 == 0)) ||
               (iVar2 = amqpvalue_get_symbol(pAVar6,(char **)&local_40), iVar2 == 0)) {
              bVar1 = true;
            }
            else {
              amqpvalue_destroy(pAVar6);
              target_destroy(*target_handle);
              iVar4 = 0x35ba;
              bVar1 = false;
            }
            if (!bVar1) {
              return iVar4;
            }
          }
          amqpvalue_destroy(pAVar6);
        }
        pAVar6 = amqpvalue_clone(value);
        pTVar5->composite_value = pAVar6;
        iVar4 = 0;
      }
    }
  }
  return iVar4;
}

Assistant:

int amqpvalue_get_target(AMQP_VALUE value, TARGET_HANDLE* target_handle)
{
    int result;
    TARGET_INSTANCE* target_instance = (TARGET_INSTANCE*)target_create_internal();
    *target_handle = target_instance;
    if (*target_handle == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        AMQP_VALUE list_value = amqpvalue_get_inplace_described_value(value);
        if (list_value == NULL)
        {
            target_destroy(*target_handle);
            result = MU_FAILURE;
        }
        else
        {
            uint32_t list_item_count;
            if (amqpvalue_get_list_item_count(list_value, &list_item_count) != 0)
            {
                result = MU_FAILURE;
            }
            else
            {
                do
                {
                    AMQP_VALUE item_value;
                    /* address */
                    if (list_item_count > 0)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 0);
                        if (item_value == NULL)
                        {
                            /* do nothing */
                        }
                        else
                        {
                            amqpvalue_destroy(item_value);
                        }
                    }
                    /* durable */
                    if (list_item_count > 1)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 1);
                        if (item_value == NULL)
                        {
                            /* do nothing */
                        }
                        else
                        {
                            if (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL)
                            {
                                /* no error, field is not mandatory */
                            }
                            else
                            {
                                terminus_durability durable;
                                if (amqpvalue_get_terminus_durability(item_value, &durable) != 0)
                                {
                                    amqpvalue_destroy(item_value);
                                    target_destroy(*target_handle);
                                    result = MU_FAILURE;
                                    break;
                                }
                            }

                            amqpvalue_destroy(item_value);
                        }
                    }
                    /* expiry-policy */
                    if (list_item_count > 2)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 2);
                        if (item_value == NULL)
                        {
                            /* do nothing */
                        }
                        else
                        {
                            if (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL)
                            {
                                /* no error, field is not mandatory */
                            }
                            else
                            {
                                terminus_expiry_policy expiry_policy;
                                if (amqpvalue_get_terminus_expiry_policy(item_value, &expiry_policy) != 0)
                                {
                                    amqpvalue_destroy(item_value);
                                    target_destroy(*target_handle);
                                    result = MU_FAILURE;
                                    break;
                                }
                            }

                            amqpvalue_destroy(item_value);
                        }
                    }
                    /* timeout */
                    if (list_item_count > 3)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 3);
                        if (item_value == NULL)
                        {
                            /* do nothing */
                        }
                        else
                        {
                            if (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL)
                            {
                                /* no error, field is not mandatory */
                            }
                            else
                            {
                                seconds timeout;
                                if (amqpvalue_get_seconds(item_value, &timeout) != 0)
                                {
                                    amqpvalue_destroy(item_value);
                                    target_destroy(*target_handle);
                                    result = MU_FAILURE;
                                    break;
                                }
                            }

                            amqpvalue_destroy(item_value);
                        }
                    }
                    /* dynamic */
                    if (list_item_count > 4)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 4);
                        if (item_value == NULL)
                        {
                            /* do nothing */
                        }
                        else
                        {
                            if (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL)
                            {
                                /* no error, field is not mandatory */
                            }
                            else
                            {
                                bool dynamic;
                                if (amqpvalue_get_boolean(item_value, &dynamic) != 0)
                                {
                                    amqpvalue_destroy(item_value);
                                    target_destroy(*target_handle);
                                    result = MU_FAILURE;
                                    break;
                                }
                            }

                            amqpvalue_destroy(item_value);
                        }
                    }
                    /* dynamic-node-properties */
                    if (list_item_count > 5)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 5);
                        if (item_value == NULL)
                        {
                            /* do nothing */
                        }
                        else
                        {
                            if (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL)
                            {
                                /* no error, field is not mandatory */
                            }
                            else
                            {
                                node_properties dynamic_node_properties;
                                if (amqpvalue_get_node_properties(item_value, &dynamic_node_properties) != 0)
                                {
                                    amqpvalue_destroy(item_value);
                                    target_destroy(*target_handle);
                                    result = MU_FAILURE;
                                    break;
                                }
                            }

                            amqpvalue_destroy(item_value);
                        }
                    }
                    /* capabilities */
                    if (list_item_count > 6)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 6);
                        if (item_value == NULL)
                        {
                            /* do nothing */
                        }
                        else
                        {
                            if (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL)
                            {
                                /* no error, field is not mandatory */
                            }
                            else
                            {
                                const char* capabilities = NULL;
                                AMQP_VALUE capabilities_array;
                                if (((amqpvalue_get_type(item_value) != AMQP_TYPE_ARRAY) || (amqpvalue_get_array(item_value, &capabilities_array) != 0)) &&
                                    (amqpvalue_get_symbol(item_value, &capabilities) != 0))
                                {
                                    amqpvalue_destroy(item_value);
                                    target_destroy(*target_handle);
                                    result = MU_FAILURE;
                                    break;
                                }
                            }

                            amqpvalue_destroy(item_value);
                        }
                    }

                    target_instance->composite_value = amqpvalue_clone(value);

                    result = 0;
                } while(0);
            }
        }
    }

    return result;
}